

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionJITTimeInfo.cpp
# Opt level: O3

void FunctionJITTimeInfo::BuildJITTimeData
               (ArenaAllocator *alloc,FunctionCodeGenJitTimeData *codeGenData,
               FunctionCodeGenRuntimeData *runtimeData,FunctionJITTimeDataIDL *jitData,
               bool isInlinee,bool isForegroundJIT)

{
  ushort uVar1;
  WriteBarrierPtr<ObjTypeSpecFldInfo> *pWVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  BOOL BVar6;
  uint uVar7;
  undefined4 *puVar8;
  FunctionInfo *pFVar9;
  FunctionBody *pFVar10;
  ByteBlock *pBVar11;
  FunctionBodyDataIDL *pFVar12;
  FunctionCodeGenRuntimeData *this;
  ProfileDataIDL *data;
  DynamicProfileInfo *profileInfo;
  ProxyEntryPointInfo *pPVar13;
  FunctionJITTimeDataIDL **ppFVar14;
  FunctionCodeGenJitTimeData *pFVar15;
  FunctionCodeGenRuntimeData *pFVar16;
  FunctionJITTimeDataIDL *pFVar17;
  FunctionJITRuntimeIDL *pFVar18;
  InlineCachePointerArray<Js::InlineCache> *pIVar19;
  long *plVar20;
  InlineCache *pIVar21;
  InlineCacheIndex inlineCacheIndex;
  size_t sVar22;
  ProfileId PVar23;
  boolean *__s;
  ulong uVar24;
  
  puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  while( true ) {
    pFVar9 = Js::FunctionCodeGenJitTimeData::GetFunctionInfo(codeGenData);
    jitData->functionInfoAddr = (long)pFVar9;
    pFVar9 = Js::FunctionCodeGenJitTimeData::GetFunctionInfo(codeGenData);
    jitData->localFuncId = pFVar9->functionId;
    jitData->isAggressiveInliningEnabled = codeGenData->isAggressiveInliningEnabled;
    jitData->isInlined = codeGenData->isInlined;
    jitData->weakFuncRef = (long)(codeGenData->weakFuncRef).ptr;
    jitData->inlineesBv = (BVFixedIDL *)(codeGenData->inlineesBv).ptr;
    jitData->entryPointInfoAddr = (long)(codeGenData->entryPointInfo).ptr;
    pFVar10 = Js::FunctionCodeGenJitTimeData::GetFunctionBody(codeGenData);
    if (pFVar10 == (FunctionBody *)0x0) break;
    pFVar10 = Js::FunctionCodeGenJitTimeData::GetFunctionBody(codeGenData);
    pBVar11 = Js::FunctionBody::GetByteCode(pFVar10);
    if (pBVar11 == (ByteBlock *)0x0) break;
    pFVar9 = Js::FunctionCodeGenJitTimeData::GetFunctionInfo(codeGenData);
    pFVar10 = (FunctionBody *)Js::FunctionInfo::GetParseableFunctionInfo(pFVar9);
    bVar4 = Js::FunctionProxy::IsFunctionBody((FunctionProxy *)pFVar10);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                         ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
      if (!bVar4) goto LAB_00435b90;
      *puVar8 = 0;
    }
    pFVar12 = (FunctionBodyDataIDL *)new<Memory::ArenaAllocator>(0x1b8,alloc,0x366836);
    jitData->bodyData = pFVar12;
    JITTimeFunctionBody::InitializeJITFunctionData(alloc,pFVar10,pFVar12);
    if ((runtimeData != (FunctionCodeGenRuntimeData *)0x0) != (bool)(isInlinee & 1U)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionJITTimeInfo.cpp"
                         ,0x2b,"(isInlinee == !!runtimeData)","isInlinee == !!runtimeData");
      if (!bVar4) goto LAB_00435b90;
      *puVar8 = 0;
    }
    if (runtimeData == (FunctionCodeGenRuntimeData *)0x0) {
      this = (FunctionCodeGenRuntimeData *)0x0;
    }
    else {
      pFVar9 = Js::FunctionCodeGenJitTimeData::GetFunctionInfo(codeGenData);
      pFVar10 = Js::FunctionInfo::GetFunctionBody(pFVar9);
      this = Js::FunctionCodeGenRuntimeData::GetForTarget(runtimeData,pFVar10);
    }
    pFVar10 = Js::FunctionCodeGenJitTimeData::GetFunctionBody(codeGenData);
    if ((pFVar10->dynamicProfileInfo).ptr != (DynamicProfileInfo *)0x0) {
      data = (ProfileDataIDL *)new<Memory::ArenaAllocator>(0xb0,alloc,0x364470);
      profileInfo = Js::FunctionBody::GetAnyDynamicProfileInfo(pFVar10);
      JITTimeProfileInfo::InitializeJITProfileData(alloc,profileInfo,pFVar10,data,isForegroundJIT);
      jitData->bodyData->profileData = data;
      if ((isInlinee & 1U) != 0) {
        pPVar13 = Js::FunctionProxy::GetDefaultEntryPointInfo((FunctionProxy *)pFVar10);
        iVar5 = (*(pPVar13->super_ExpirableObject).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[8])(pPVar13);
        if ((char)iVar5 == '\0') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionJITTimeInfo.cpp"
                             ,0x3f,"(defaultEntryPointInfo->IsFunctionEntryPointInfo())",
                             "defaultEntryPointInfo->IsFunctionEntryPointInfo()");
          if (!bVar4) goto LAB_00435b90;
          *puVar8 = 0;
        }
        jitData->callsCountAddress =
             (long)((long)&pPVar13[5].super_ExpirableObject.super_FinalizableObject.
                           super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + 4);
        jitData->sharedPropertyGuards = (codeGenData->sharedPropertyGuards).ptr;
        jitData->sharedPropGuardCount = codeGenData->sharedPropertyGuardCount;
      }
    }
    uVar1 = jitData->bodyData->profiledCallSiteCount;
    if (uVar1 != 0) {
      jitData->inlineeCount = (uint)uVar1;
      BVar6 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar6 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar4) goto LAB_00435b90;
        *puVar8 = 0;
      }
      uVar24 = (ulong)uVar1;
      sVar22 = uVar24 * 8;
      ppFVar14 = (FunctionJITTimeDataIDL **)
                 Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 AllocInternal(&alloc->
                                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                               ,sVar22);
      memset(ppFVar14,0,sVar22);
      memset(ppFVar14 + uVar24,0,(ulong)((int)sVar22 + 0xfU & 0xfffffff0) + uVar24 * -8);
      if (ppFVar14 == (FunctionJITTimeDataIDL **)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar4) goto LAB_00435b90;
        *puVar8 = 0;
      }
      jitData->inlinees = ppFVar14;
      uVar1 = jitData->bodyData->profiledCallSiteCount;
      uVar24 = (ulong)uVar1;
      __s = &DAT_00000008;
      if (uVar24 != 0) {
        BVar6 = ExceptionCheck::CanHandleOutOfMemory();
        if (BVar6 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                             "ExceptionCheck::CanHandleOutOfMemory()");
          if (!bVar4) goto LAB_00435b90;
          *puVar8 = 0;
        }
        __s = (boolean *)
              Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
              AllocInternal(&alloc->
                             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                            ,uVar24);
        memset(__s,0,uVar24);
        memset(__s + uVar24,0,(uVar1 + 0xf & 0xfffffff0) - uVar24);
        if (__s == (boolean *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
          if (!bVar4) goto LAB_00435b90;
          *puVar8 = 0;
          __s = (boolean *)0x0;
        }
      }
      jitData->inlineesRecursionFlags = __s;
      if (jitData->bodyData->profiledCallSiteCount == 0) {
        ppFVar14 = (FunctionJITTimeDataIDL **)&DAT_00000008;
      }
      else {
        uVar24 = 0;
        do {
          PVar23 = (ProfileId)uVar24;
          pFVar15 = Js::FunctionCodeGenJitTimeData::GetInlinee(codeGenData,PVar23);
          if (pFVar15 == codeGenData) {
            jitData->inlineesRecursionFlags[uVar24] = '\x01';
          }
          else if (pFVar15 != (FunctionCodeGenJitTimeData *)0x0) {
            pFVar9 = Js::FunctionCodeGenJitTimeData::GetFunctionInfo(pFVar15);
            if ((pFVar9->functionBodyImpl).ptr == (FunctionProxy *)0x0) {
              pFVar16 = (FunctionCodeGenRuntimeData *)0x0;
            }
            else if ((isInlinee & 1U) == 0) {
              pFVar16 = Js::FunctionBody::GetInlineeCodeGenRuntimeData(pFVar10,PVar23);
            }
            else {
              pFVar16 = Js::FunctionCodeGenRuntimeData::GetInlinee(this,PVar23);
            }
            pFVar17 = (FunctionJITTimeDataIDL *)new<Memory::ArenaAllocator>(0xa8,alloc,0x366836);
            jitData->inlinees[uVar24] = pFVar17;
            BuildJITTimeData(alloc,pFVar15,pFVar16,jitData->inlinees[uVar24],true,isForegroundJIT);
          }
          uVar24 = uVar24 + 1;
          uVar1 = jitData->bodyData->profiledCallSiteCount;
        } while (uVar24 < uVar1);
        ppFVar14 = (FunctionJITTimeDataIDL **)&DAT_00000008;
        if ((ulong)uVar1 != 0) {
          BVar6 = ExceptionCheck::CanHandleOutOfMemory();
          if (BVar6 == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar8 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                               ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                               "ExceptionCheck::CanHandleOutOfMemory()");
            if (!bVar4) goto LAB_00435b90;
            *puVar8 = 0;
          }
          uVar24 = (ulong)uVar1;
          sVar22 = uVar24 * 8;
          ppFVar14 = (FunctionJITTimeDataIDL **)
                     Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                     AllocInternal(&alloc->
                                    super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                   ,sVar22);
          memset(ppFVar14,0,sVar22);
          memset(ppFVar14 + uVar24,0,(ulong)((int)sVar22 + 0xfU & 0xfffffff0) + uVar24 * -8);
          if (ppFVar14 == (FunctionJITTimeDataIDL **)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar8 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                               ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
            if (!bVar4) goto LAB_00435b90;
            *puVar8 = 0;
            ppFVar14 = (FunctionJITTimeDataIDL **)0x0;
          }
        }
      }
      jitData->callbackInlinees = ppFVar14;
      pFVar12 = jitData->bodyData;
      if (pFVar12->profiledCallSiteCount != 0) {
        uVar24 = 0;
        do {
          PVar23 = (ProfileId)uVar24;
          pFVar15 = Js::FunctionCodeGenJitTimeData::GetCallbackInlinee(codeGenData,PVar23);
          if (pFVar15 != (FunctionCodeGenJitTimeData *)0x0) {
            pFVar9 = Js::FunctionCodeGenJitTimeData::GetFunctionInfo(pFVar15);
            if ((pFVar9->functionBodyImpl).ptr == (FunctionProxy *)0x0) {
              pFVar16 = (FunctionCodeGenRuntimeData *)0x0;
            }
            else if ((isInlinee & 1U) == 0) {
              pFVar16 = Js::FunctionBody::GetCallbackInlineeCodeGenRuntimeData(pFVar10,PVar23);
            }
            else {
              pFVar16 = Js::FunctionCodeGenRuntimeData::GetCallbackInlinee(this,PVar23);
            }
            pFVar17 = (FunctionJITTimeDataIDL *)new<Memory::ArenaAllocator>(0xa8,alloc,0x366836);
            jitData->callbackInlinees[uVar24] = pFVar17;
            BuildJITTimeData(alloc,pFVar15,pFVar16,jitData->callbackInlinees[uVar24],true,
                             isForegroundJIT);
          }
          uVar24 = uVar24 + 1;
          pFVar12 = jitData->bodyData;
        } while (uVar24 < pFVar12->profiledCallSiteCount);
      }
      uVar1 = pFVar12->profiledCallApplyCallSiteCount;
      jitData->callApplyTargetInlineeCount = (uint)uVar1;
      if (uVar1 != 0) {
        BVar6 = ExceptionCheck::CanHandleOutOfMemory();
        if (BVar6 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                             "ExceptionCheck::CanHandleOutOfMemory()");
          if (!bVar4) goto LAB_00435b90;
          *puVar8 = 0;
        }
        uVar24 = (ulong)uVar1;
        sVar22 = uVar24 * 8;
        ppFVar14 = (FunctionJITTimeDataIDL **)
                   Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                   AllocInternal(&alloc->
                                  super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                 ,sVar22);
        memset(ppFVar14,0,sVar22);
        memset(ppFVar14 + uVar24,0,(ulong)((int)sVar22 + 0xfU & 0xfffffff0) + uVar24 * -8);
        if (ppFVar14 == (FunctionJITTimeDataIDL **)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
          if (!bVar4) goto LAB_00435b90;
          *puVar8 = 0;
        }
        jitData->callApplyTargetInlinees = ppFVar14;
        if (jitData->bodyData->profiledCallApplyCallSiteCount != 0) {
          uVar24 = 0;
          do {
            PVar23 = (ProfileId)uVar24;
            pFVar15 = Js::FunctionCodeGenJitTimeData::GetCallApplyTargetInlinee(codeGenData,PVar23);
            if (pFVar15 != (FunctionCodeGenJitTimeData *)0x0) {
              pFVar9 = Js::FunctionCodeGenJitTimeData::GetFunctionInfo(pFVar15);
              if ((pFVar9->functionBodyImpl).ptr == (FunctionProxy *)0x0) {
                pFVar16 = (FunctionCodeGenRuntimeData *)0x0;
              }
              else if ((isInlinee & 1U) == 0) {
                pFVar16 = Js::FunctionBody::GetCallApplyTargetInlineeCodeGenRuntimeData
                                    (pFVar10,PVar23);
              }
              else {
                pFVar16 = Js::FunctionCodeGenRuntimeData::GetCallApplyTargetInlinee(this,PVar23);
              }
              pFVar17 = (FunctionJITTimeDataIDL *)new<Memory::ArenaAllocator>(0xa8,alloc,0x366836);
              jitData->callApplyTargetInlinees[uVar24] = pFVar17;
              BuildJITTimeData(alloc,pFVar15,pFVar16,jitData->callApplyTargetInlinees[uVar24],true,
                               isForegroundJIT);
            }
            uVar24 = uVar24 + 1;
          } while (uVar24 < jitData->bodyData->profiledCallApplyCallSiteCount);
        }
      }
    }
    pFVar18 = (FunctionJITRuntimeIDL *)new<Memory::ArenaAllocator>(0x10,alloc,0x366836);
    jitData->profiledRuntimeData = pFVar18;
    if ((isInlinee & 1U) == 0) {
      pFVar12 = jitData->bodyData;
    }
    else {
      pIVar19 = Js::FunctionCodeGenRuntimeData::ClonedInlineCaches(this);
      pFVar12 = jitData->bodyData;
      if ((pIVar19->inlineCaches).ptr != (WriteBarrierPtr<Js::InlineCache> *)0x0) {
        uVar7 = pFVar12->inlineCacheCount;
        jitData->profiledRuntimeData->clonedCacheCount = uVar7;
        if ((ulong)uVar7 == 0) {
          plVar20 = (long *)&DAT_00000008;
        }
        else {
          BVar6 = ExceptionCheck::CanHandleOutOfMemory();
          if (BVar6 == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar8 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                               ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                               "ExceptionCheck::CanHandleOutOfMemory()");
            if (!bVar4) goto LAB_00435b90;
            *puVar8 = 0;
          }
          plVar20 = (long *)Memory::
                            ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                            AllocInternal(&alloc->
                                           super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                          ,(ulong)uVar7 << 3);
          if (plVar20 == (long *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar8 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                               ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
            if (!bVar4) goto LAB_00435b90;
            *puVar8 = 0;
            plVar20 = (long *)0x0;
          }
        }
        jitData->profiledRuntimeData->clonedInlineCaches = plVar20;
        pFVar12 = jitData->bodyData;
        if (pFVar12->inlineCacheCount != 0) {
          uVar24 = 0;
          do {
            pIVar19 = Js::FunctionCodeGenRuntimeData::ClonedInlineCaches(this);
            pIVar21 = Js::InlineCachePointerArray<Js::InlineCache>::GetInlineCache
                                (pIVar19,(uint)uVar24);
            jitData->profiledRuntimeData->clonedInlineCaches[uVar24] = (long)pIVar21;
            uVar24 = uVar24 + 1;
            pFVar12 = jitData->bodyData;
          } while (uVar24 < pFVar12->inlineCacheCount);
        }
      }
    }
    uVar24 = (ulong)pFVar12->inlineCacheCount;
    if (uVar24 != 0) {
      jitData->ldFldInlineeCount = pFVar12->inlineCacheCount;
      BVar6 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar6 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar4) goto LAB_00435b90;
        *puVar8 = 0;
      }
      sVar22 = uVar24 * 8;
      ppFVar14 = (FunctionJITTimeDataIDL **)
                 Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 AllocInternal(&alloc->
                                super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                               ,sVar22);
      memset(ppFVar14,0,sVar22);
      memset(ppFVar14 + uVar24,0,(sVar22 + 0xf & 0xfffffffffffffff0) + uVar24 * -8);
      if (ppFVar14 == (FunctionJITTimeDataIDL **)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar4) goto LAB_00435b90;
        *puVar8 = 0;
      }
      jitData->ldFldInlinees = ppFVar14;
      pWVar2 = (codeGenData->objTypeSpecFldInfoArray).infoArray.ptr;
      uVar7 = jitData->bodyData->inlineCacheCount;
      if (pWVar2 != (WriteBarrierPtr<ObjTypeSpecFldInfo> *)0x0) {
        jitData->objTypeSpecFldInfoCount = uVar7;
        jitData->objTypeSpecFldInfoArray = (ObjTypeSpecFldIDL **)pWVar2;
      }
      if (uVar7 != 0) {
        uVar24 = 0;
        do {
          inlineCacheIndex = (InlineCacheIndex)uVar24;
          pFVar15 = Js::FunctionCodeGenJitTimeData::GetLdFldInlinee(codeGenData,inlineCacheIndex);
          if ((isInlinee & 1U) == 0) {
            pFVar16 = Js::FunctionBody::GetLdFldInlineeCodeGenRuntimeData(pFVar10,inlineCacheIndex);
          }
          else {
            pFVar16 = Js::FunctionCodeGenRuntimeData::GetLdFldInlinee(this,inlineCacheIndex);
          }
          if (pFVar15 != (FunctionCodeGenJitTimeData *)0x0) {
            pFVar17 = (FunctionJITTimeDataIDL *)new<Memory::ArenaAllocator>(0xa8,alloc,0x366836);
            jitData->ldFldInlinees[uVar24] = pFVar17;
            BuildJITTimeData(alloc,pFVar15,pFVar16,jitData->ldFldInlinees[uVar24],true,
                             isForegroundJIT);
          }
          uVar24 = uVar24 + 1;
        } while (uVar24 < jitData->bodyData->inlineCacheCount);
      }
    }
    if ((isInlinee & 1U) == 0) {
      uVar7 = codeGenData->globalObjTypeSpecFldInfoCount;
      if (uVar7 != 0) {
        pWVar2 = (codeGenData->globalObjTypeSpecFldInfoArray).ptr;
        if (pWVar2 == (WriteBarrierPtr<ObjTypeSpecFldInfo> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionJITTimeInfo.cpp"
                             ,0xa9,"(globObjTypeSpecInfo != nullptr)",
                             "globObjTypeSpecInfo != nullptr");
          if (!bVar4) goto LAB_00435b90;
          *puVar8 = 0;
          uVar7 = codeGenData->globalObjTypeSpecFldInfoCount;
        }
        jitData->globalObjTypeSpecFldInfoCount = uVar7;
        jitData->globalObjTypeSpecFldInfoArray = (ObjTypeSpecFldIDL **)pWVar2;
      }
      codeGenData = (codeGenData->next).ptr;
      if (codeGenData == (FunctionCodeGenJitTimeData *)0x0) {
        return;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionJITTimeInfo.cpp"
                         ,0xb2,"(isInlinee)","isInlinee");
      if (!bVar4) goto LAB_00435b90;
      *puVar8 = 0;
    }
    else {
      codeGenData = (codeGenData->next).ptr;
      if (codeGenData == (FunctionCodeGenJitTimeData *)0x0) {
        return;
      }
    }
    pFVar17 = (FunctionJITTimeDataIDL *)new<Memory::ArenaAllocator>(0xa8,alloc,0x366836);
    jitData->next = pFVar17;
    isInlinee = true;
    jitData = pFVar17;
  }
  if ((isInlinee & 1U) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionJITTimeInfo.cpp"
                       ,0x23,"(isInlinee)","isInlinee");
    if (!bVar4) {
LAB_00435b90:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
  return;
}

Assistant:

void
FunctionJITTimeInfo::BuildJITTimeData(
    __in ArenaAllocator * alloc,
    __in const Js::FunctionCodeGenJitTimeData * codeGenData,
    __in_opt const Js::FunctionCodeGenRuntimeData * runtimeData,
    __out FunctionJITTimeDataIDL * jitData,
    bool isInlinee,
    bool isForegroundJIT)
{
    jitData->functionInfoAddr = (intptr_t)codeGenData->GetFunctionInfo();
    jitData->localFuncId = codeGenData->GetFunctionInfo()->GetLocalFunctionId();
    jitData->isAggressiveInliningEnabled = codeGenData->GetIsAggressiveInliningEnabled();
    jitData->isInlined = codeGenData->GetIsInlined();
    jitData->weakFuncRef = (intptr_t)codeGenData->GetWeakFuncRef();
    jitData->inlineesBv = (BVFixedIDL*)(const BVFixed*)codeGenData->inlineesBv;
    jitData->entryPointInfoAddr = (intptr_t)codeGenData->GetEntryPointInfo();

    if (!codeGenData->GetFunctionBody() || !codeGenData->GetFunctionBody()->GetByteCode())
    {
        // outermost function must have a body, but inlinees may not (if they are builtins)
        Assert(isInlinee);
        return;
    }

    Js::FunctionBody * body = codeGenData->GetFunctionInfo()->GetParseableFunctionInfo()->GetFunctionBody();
    jitData->bodyData = AnewStructZ(alloc, FunctionBodyDataIDL);
    JITTimeFunctionBody::InitializeJITFunctionData(alloc, body, jitData->bodyData);

    Assert(isInlinee == !!runtimeData);
    const Js::FunctionCodeGenRuntimeData * targetRuntimeData = nullptr;
    if (runtimeData)
    {
        // may be polymorphic, so seek the runtime data matching our JIT time data
        targetRuntimeData = runtimeData->GetForTarget(codeGenData->GetFunctionInfo()->GetFunctionBody());
    }
    Js::FunctionBody * functionBody = codeGenData->GetFunctionBody();
    if (functionBody->HasDynamicProfileInfo())
    {
        ProfileDataIDL * profileData = AnewStruct(alloc, ProfileDataIDL);
        JITTimeProfileInfo::InitializeJITProfileData(alloc, functionBody->GetAnyDynamicProfileInfo(), functionBody, profileData, isForegroundJIT);

        jitData->bodyData->profileData = profileData;

        if (isInlinee)
        {
            // if not inlinee, NativeCodeGenerator will provide the address
            // REVIEW: OOP JIT, for inlinees, is this actually necessary?
            Js::ProxyEntryPointInfo *defaultEntryPointInfo = functionBody->GetDefaultEntryPointInfo();
            Assert(defaultEntryPointInfo->IsFunctionEntryPointInfo());
            Js::FunctionEntryPointInfo *functionEntryPointInfo = static_cast<Js::FunctionEntryPointInfo*>(defaultEntryPointInfo);
            jitData->callsCountAddress = (intptr_t)&functionEntryPointInfo->callsCount;

            jitData->sharedPropertyGuards = codeGenData->sharedPropertyGuards;
            jitData->sharedPropGuardCount = codeGenData->sharedPropertyGuardCount;
        }
    }
    if (jitData->bodyData->profiledCallSiteCount > 0)
    {
        jitData->inlineeCount = jitData->bodyData->profiledCallSiteCount;
        // using arena because we can't recycler allocate (may be on background), and heap freeing this is slightly complicated
        jitData->inlinees = AnewArrayZ(alloc, FunctionJITTimeDataIDL*, jitData->bodyData->profiledCallSiteCount);
        jitData->inlineesRecursionFlags = AnewArrayZ(alloc, boolean, jitData->bodyData->profiledCallSiteCount);

        for (Js::ProfileId i = 0; i < jitData->bodyData->profiledCallSiteCount; ++i)
        {
            const Js::FunctionCodeGenJitTimeData * inlineeJITData = codeGenData->GetInlinee(i);
            if (inlineeJITData == codeGenData)
            {
                jitData->inlineesRecursionFlags[i] = TRUE;
            }
            else if (inlineeJITData != nullptr)
            {
                const Js::FunctionCodeGenRuntimeData * inlineeRuntimeData = nullptr;
                if (inlineeJITData->GetFunctionInfo()->HasBody())
                {
                    inlineeRuntimeData = isInlinee ? targetRuntimeData->GetInlinee(i) : functionBody->GetInlineeCodeGenRuntimeData(i);
                }
                jitData->inlinees[i] = AnewStructZ(alloc, FunctionJITTimeDataIDL);
                BuildJITTimeData(alloc, inlineeJITData, inlineeRuntimeData, jitData->inlinees[i], true, isForegroundJIT);
            }
        }

        jitData->callbackInlinees = AnewArrayZ(alloc, FunctionJITTimeDataIDL*, jitData->bodyData->profiledCallSiteCount);

        for (Js::ProfileId i = 0; i < jitData->bodyData->profiledCallSiteCount; ++i)
        {
            const Js::FunctionCodeGenJitTimeData * inlineeJITData = codeGenData->GetCallbackInlinee(i);
            if (inlineeJITData != nullptr)
            {
                const Js::FunctionCodeGenRuntimeData * inlineeRuntimeData = nullptr;
                if (inlineeJITData->GetFunctionInfo()->HasBody())
                {
                    inlineeRuntimeData = isInlinee ? targetRuntimeData->GetCallbackInlinee(i) : functionBody->GetCallbackInlineeCodeGenRuntimeData(i);
                }
                jitData->callbackInlinees[i] = AnewStructZ(alloc, FunctionJITTimeDataIDL);
                BuildJITTimeData(alloc, inlineeJITData, inlineeRuntimeData, jitData->callbackInlinees[i], true, isForegroundJIT);
            }
        }

        jitData->callApplyTargetInlineeCount = jitData->bodyData->profiledCallApplyCallSiteCount;
        if (jitData->bodyData->profiledCallApplyCallSiteCount > 0)
        {
            jitData->callApplyTargetInlinees = AnewArrayZ(alloc, FunctionJITTimeDataIDL*, jitData->bodyData->profiledCallApplyCallSiteCount);
        }
        for (Js::ProfileId i = 0; i < jitData->bodyData->profiledCallApplyCallSiteCount; ++i)
        {
            const Js::FunctionCodeGenJitTimeData * inlineeJITData = codeGenData->GetCallApplyTargetInlinee(i);
            if (inlineeJITData != nullptr)
            {
                const Js::FunctionCodeGenRuntimeData * inlineeRuntimeData = nullptr;
                if (inlineeJITData->GetFunctionInfo()->HasBody())
                {
                    inlineeRuntimeData = isInlinee ? targetRuntimeData->GetCallApplyTargetInlinee(i) : functionBody->GetCallApplyTargetInlineeCodeGenRuntimeData(i);
                }
                jitData->callApplyTargetInlinees[i] = AnewStructZ(alloc, FunctionJITTimeDataIDL);
                BuildJITTimeData(alloc, inlineeJITData, inlineeRuntimeData, jitData->callApplyTargetInlinees[i], true, isForegroundJIT);
            }
        }
    }
    jitData->profiledRuntimeData = AnewStructZ(alloc, FunctionJITRuntimeIDL);
    if (isInlinee && targetRuntimeData->ClonedInlineCaches()->HasInlineCaches())
    {
        jitData->profiledRuntimeData->clonedCacheCount = jitData->bodyData->inlineCacheCount;
        jitData->profiledRuntimeData->clonedInlineCaches = AnewArray(alloc, intptr_t, jitData->profiledRuntimeData->clonedCacheCount);
        for (uint j = 0; j < jitData->bodyData->inlineCacheCount; ++j)
        {
            jitData->profiledRuntimeData->clonedInlineCaches[j] = (intptr_t)targetRuntimeData->ClonedInlineCaches()->GetInlineCache(j);
        }
    }
    if (jitData->bodyData->inlineCacheCount > 0)
    {
        jitData->ldFldInlineeCount = jitData->bodyData->inlineCacheCount;
        jitData->ldFldInlinees = AnewArrayZ(alloc, FunctionJITTimeDataIDL*, jitData->bodyData->inlineCacheCount);

        Field(ObjTypeSpecFldInfo*)* objTypeSpecInfo = codeGenData->GetObjTypeSpecFldInfoArray()->GetInfoArray();
        if(objTypeSpecInfo)
        {
            jitData->objTypeSpecFldInfoCount = jitData->bodyData->inlineCacheCount;
            jitData->objTypeSpecFldInfoArray = unsafe_write_barrier_cast<ObjTypeSpecFldIDL**>(objTypeSpecInfo);
        }
        for (Js::InlineCacheIndex i = 0; i < jitData->bodyData->inlineCacheCount; ++i)
        {
            const Js::FunctionCodeGenJitTimeData * inlineeJITData = codeGenData->GetLdFldInlinee(i);
            const Js::FunctionCodeGenRuntimeData * inlineeRuntimeData = isInlinee ? targetRuntimeData->GetLdFldInlinee(i) : functionBody->GetLdFldInlineeCodeGenRuntimeData(i);
            if (inlineeJITData != nullptr)
            {
                jitData->ldFldInlinees[i] = AnewStructZ(alloc, FunctionJITTimeDataIDL);
                BuildJITTimeData(alloc, inlineeJITData, inlineeRuntimeData, jitData->ldFldInlinees[i], true, isForegroundJIT);
            }
        }
    }
    if (!isInlinee && codeGenData->GetGlobalObjTypeSpecFldInfoCount() > 0)
    {
        Field(ObjTypeSpecFldInfo*)* globObjTypeSpecInfo = codeGenData->GetGlobalObjTypeSpecFldInfoArray();
        Assert(globObjTypeSpecInfo != nullptr);

        jitData->globalObjTypeSpecFldInfoCount = codeGenData->GetGlobalObjTypeSpecFldInfoCount();
        jitData->globalObjTypeSpecFldInfoArray = unsafe_write_barrier_cast<ObjTypeSpecFldIDL**>(globObjTypeSpecInfo);
    }
    const Js::FunctionCodeGenJitTimeData * nextJITData = codeGenData->GetNext();
    if (nextJITData != nullptr)
    {
        // only inlinee should be polymorphic
        Assert(isInlinee);
        jitData->next = AnewStructZ(alloc, FunctionJITTimeDataIDL);
        BuildJITTimeData(alloc, nextJITData, runtimeData, jitData->next, true, isForegroundJIT);
    }
}